

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O3

bool __thiscall
cmDepends::CheckDependencies
          (cmDepends *this,istream *internalDepends,string *internalDependsFileName,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
          *validDeps)

{
  size_t sVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *this_00;
  byte bVar2;
  bool bVar3;
  long *plVar4;
  undefined7 extraout_var;
  ostream *poVar5;
  size_t sVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  byte *__src;
  bool bVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  pVar10;
  int result;
  string dependee;
  string depender;
  ostringstream msg;
  int local_22c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_228;
  string local_220;
  ulong local_200;
  value_type local_1f8;
  string local_1d8;
  string *local_1b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar9 = true;
  local_200 = 0;
  local_228 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0;
  local_1b8 = internalDependsFileName;
  local_1b0 = &validDeps->_M_t;
LAB_003ff012:
  do {
    __src = (byte *)this->Dependee;
    do {
      sVar1 = this->MaxPath;
      std::ios::widen((char)*(undefined8 *)(*(long *)internalDepends + -0x18) +
                      (char)internalDepends);
      plVar4 = (long *)std::istream::getline((char *)internalDepends,(long)__src,(char)sVar1);
      if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) {
        return bVar9;
      }
      __src = (byte *)this->Dependee;
      bVar2 = *__src;
    } while (((ulong)bVar2 < 0x24) && ((0x800002001U >> ((ulong)bVar2 & 0x3f) & 1) != 0));
    sVar6 = *(size_t *)(internalDepends + 8);
    if (__src[sVar6 - 2] == 0xd) {
      __src[sVar6 - 2] = 0;
      sVar6 = sVar6 - 1;
      __src = (byte *)this->Dependee;
      bVar2 = *__src;
    }
    if (bVar2 != 0x20) goto code_r0x003ff088;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    sVar6 = strlen((char *)(__src + 1));
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,__src + 1,__src + sVar6 + 1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,this->Depender,(allocator<char> *)local_1a8);
    if (local_228 !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_228,&local_1f8);
    }
    bVar3 = cmsys::SystemTools::FileExists(&local_1f8);
    if (bVar3) {
      if ((local_200 & 1) == 0) {
        local_22c = 0;
        bVar3 = cmFileTimeCache::Compare(this->FileTimeCache,local_1b8,&local_1f8,&local_22c);
        if (!bVar3 || local_22c < 0) {
          if (this->Verbose == true) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Dependee \"",10);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,
                                local_1f8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\" is newer than depends file \"",0x1e);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(local_1b8->_M_dataplus)._M_p,local_1b8->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
            std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            std::__cxx11::stringbuf::str();
            cmSystemTools::Stdout(&local_220);
            goto LAB_003ff33f;
          }
          goto LAB_003ff377;
        }
      }
      else {
        local_22c = 0;
        bVar3 = cmFileTimeCache::Compare(this->FileTimeCache,&local_1d8,&local_1f8,&local_22c);
        if (!bVar3 || local_22c < 0) {
          if (this->Verbose == true) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Dependee \"",10);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,
                                local_1f8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\" is newer than depender \"",0x1a);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
            std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            std::__cxx11::stringbuf::str();
            cmSystemTools::Stdout(&local_220);
            goto LAB_003ff33f;
          }
          goto LAB_003ff377;
        }
      }
    }
    else {
      if (this->Verbose == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Dependee \"",10);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,
                            local_1f8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"\" does not exist for depender \"",0x1f);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        cmSystemTools::Stdout(&local_220);
LAB_003ff33f:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
LAB_003ff377:
      if (local_228 !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a8,this->Depender,(allocator<char> *)&local_220);
        this_00 = local_1b0;
        pVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                 ::equal_range(local_1b0,(key_type *)local_1a8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
        ::_M_erase_aux(this_00,(_Base_ptr)pVar10.first._M_node,(_Base_ptr)pVar10.second._M_node);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
      }
      if ((local_200 & 1) != 0) {
        cmsys::SystemTools::RemoveFile(&local_1d8);
        local_200 = 0;
      }
      bVar9 = false;
      local_228 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    uVar7 = local_1f8.field_2._M_allocated_capacity;
    _Var8._M_p = local_1f8._M_dataplus._M_p;
  } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1f8._M_dataplus._M_p == &local_1f8.field_2);
  goto LAB_003ff0f1;
code_r0x003ff088:
  memcpy(this->Depender,__src,sVar6);
  bVar3 = cmsys::SystemTools::FileExists(this->Depender);
  local_200 = CONCAT71(extraout_var,bVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,this->Depender,(allocator<char> *)&local_1f8);
  local_228 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                             *)local_1b0,(key_type *)local_1a8)->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  uVar7 = local_1a8._16_8_;
  _Var8._M_p = (pointer)local_1a8._0_8_;
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
LAB_003ff0f1:
    operator_delete(_Var8._M_p,uVar7 + 1);
  }
  goto LAB_003ff012;
}

Assistant:

bool cmDepends::CheckDependencies(
  std::istream& internalDepends, const std::string& internalDependsFileName,
  std::map<std::string, DependencyVector>& validDeps)
{
  // Parse dependencies from the stream.  If any dependee is missing
  // or newer than the depender then dependencies should be
  // regenerated.
  bool okay = true;
  bool dependerExists = false;
  DependencyVector* currentDependencies = nullptr;

  while (internalDepends.getline(this->Dependee, this->MaxPath)) {
    if (this->Dependee[0] == 0 || this->Dependee[0] == '#' ||
        this->Dependee[0] == '\r') {
      continue;
    }
    size_t len = internalDepends.gcount() - 1;
    if (this->Dependee[len - 1] == '\r') {
      len--;
      this->Dependee[len] = 0;
    }
    if (this->Dependee[0] != ' ') {
      memcpy(this->Depender, this->Dependee, len + 1);
      // Calling FileExists() for the depender here saves in many cases 50%
      // of the calls to FileExists() further down in the loop. E.g. for
      // kdelibs/khtml this reduces the number of calls from 184k down to 92k,
      // or the time for cmake -E cmake_depends from 0.3 s down to 0.21 s.
      dependerExists = cmSystemTools::FileExists(this->Depender);
      // If we erase validDeps[this->Depender] by overwriting it with an empty
      // vector, we lose dependencies for dependers that have multiple
      // entries. No need to initialize the entry, std::map will do so on first
      // access.
      currentDependencies = &validDeps[this->Depender];
      continue;
    }
    /*
    // Parse the dependency line.
    if(!this->ParseDependency(line.c_str()))
      {
      continue;
      }
      */

    // Dependencies must be regenerated
    // * if the dependee does not exist
    // * if the depender exists and is older than the dependee.
    // * if the depender does not exist, but the dependee is newer than the
    //   depends file
    bool regenerate = false;
    const std::string dependee(this->Dependee + 1);
    const std::string depender(this->Depender);
    if (currentDependencies != nullptr) {
      currentDependencies->push_back(dependee);
    }

    if (!cmSystemTools::FileExists(dependee)) {
      // The dependee does not exist.
      regenerate = true;

      // Print verbose output.
      if (this->Verbose) {
        std::ostringstream msg;
        msg << "Dependee \"" << dependee << "\" does not exist for depender \""
            << depender << "\"." << std::endl;
        cmSystemTools::Stdout(msg.str());
      }
    } else {
      if (dependerExists) {
        // The dependee and depender both exist.  Compare file times.
        int result = 0;
        if ((!this->FileTimeCache->Compare(depender, dependee, &result) ||
             result < 0)) {
          // The depender is older than the dependee.
          regenerate = true;

          // Print verbose output.
          if (this->Verbose) {
            std::ostringstream msg;
            msg << "Dependee \"" << dependee << "\" is newer than depender \""
                << depender << "\"." << std::endl;
            cmSystemTools::Stdout(msg.str());
          }
        }
      } else {
        // The dependee exists, but the depender doesn't. Regenerate if the
        // internalDepends file is older than the dependee.
        int result = 0;
        if ((!this->FileTimeCache->Compare(internalDependsFileName, dependee,
                                           &result) ||
             result < 0)) {
          // The depends-file is older than the dependee.
          regenerate = true;

          // Print verbose output.
          if (this->Verbose) {
            std::ostringstream msg;
            msg << "Dependee \"" << dependee
                << "\" is newer than depends file \""
                << internalDependsFileName << "\"." << std::endl;
            cmSystemTools::Stdout(msg.str());
          }
        }
      }
    }
    if (regenerate) {
      // Dependencies must be regenerated.
      okay = false;

      // Remove the information of this depender from the map, it needs
      // to be rescanned
      if (currentDependencies != nullptr) {
        validDeps.erase(this->Depender);
        currentDependencies = nullptr;
      }

      // Remove the depender to be sure it is rebuilt.
      if (dependerExists) {
        cmSystemTools::RemoveFile(depender);
        dependerExists = false;
      }
    }
  }

  return okay;
}